

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::train(FastText *this,shared_ptr<fasttext::Args> *args)

{
  shared_ptr<fasttext::Dictionary> *this_00;
  bool bVar1;
  char cVar2;
  int32_t iVar3;
  ostream *poVar4;
  clock_t cVar5;
  int iVar6;
  pointer ptVar7;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  __shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> local_278;
  thread local_268;
  shared_ptr<fasttext::Matrix> *local_260;
  string local_258;
  ifstream ifs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230 [64];
  
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             &args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)&ifs);
  this_00 = &this->dict_;
  std::__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2> *)&ifs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_230);
  bVar1 = std::operator==(&((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           input,"-");
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot use stdin for training!");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    std::ifstream::ifstream
              (&ifs,(string *)
                    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      Dictionary::readFromFile
                ((this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,(istream *)&ifs);
      std::ifstream::close();
      if ((((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          pretrainedVectors)._M_string_length == 0) {
        iVar3 = Dictionary::nwords((this_00->
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
        local_278._M_ptr =
             (element_type *)
             CONCAT44(local_278._M_ptr._4_4_,
                      iVar3 + ((this->args_).
                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->bucket);
        std::make_shared<fasttext::Matrix,int,int&>((int *)&threads,(int *)&local_278);
        std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&threads);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        Matrix::uniform((this->input_).
                        super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        1.0 / (float)((this->args_).
                                      super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->dim);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"loading pre-trained subwords from: ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        &((this->args_).
                                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->pretrainedVectors);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::string
                  ((string *)&local_258,
                   (string *)
                   &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pretrainedVectors);
        loadVectors(this,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
      }
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model == sup) {
        iVar3 = Dictionary::nlabels((this_00->
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr);
        local_278._M_ptr = (element_type *)CONCAT44(local_278._M_ptr._4_4_,iVar3);
        std::make_shared<fasttext::Matrix,int,int&>((int *)&threads,(int *)&local_278);
      }
      else {
        iVar3 = Dictionary::nwords((this_00->
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
        local_278._M_ptr = (element_type *)CONCAT44(local_278._M_ptr._4_4_,iVar3);
        std::make_shared<fasttext::Matrix,int,int&>((int *)&threads,(int *)&local_278);
      }
      std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&threads);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      Matrix::zero((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      cVar5 = clock();
      this->start = cVar5;
      LOCK();
      (this->tokenCount).super___atomic_base<long>._M_i = 0;
      UNLOCK();
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      poVar4 = std::operator<<((ostream *)&std::cout,"Created threads: ");
      iVar3 = Dictionary::nwords((this_00->
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
      local_260 = &this->output_;
      for (iVar6 = 0;
          ptVar7 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start,
          iVar6 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->thread; iVar6 = iVar6 + 1) {
        local_268._M_id._M_thread = (id)0;
        local_278._M_ptr = (element_type *)operator_new(0x18);
        ((local_278._M_ptr)->wi_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&PTR___State_0012ad10;
        ((local_278._M_ptr)->wi_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        *(int *)&((local_278._M_ptr)->wo_).
                 super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = iVar6;
        std::thread::_M_start_thread(&local_268,&local_278,0);
        if (local_278._M_ptr != (element_type *)0x0) {
          (*(code *)(((local_278._M_ptr)->wi_).
                     super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_)()
          ;
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,&local_268);
        std::thread::~thread(&local_268);
      }
      for (; ptVar7 != threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish; ptVar7 = ptVar7 + 1) {
        std::thread::join();
      }
      local_268._M_id._M_thread = (id)((ulong)local_268._M_id._M_thread & 0xffffffff00000000);
      std::
      make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
                ((shared_ptr<fasttext::Matrix> *)&local_278,&this->input_,
                 (shared_ptr<fasttext::Args> *)local_260,(int *)this);
      std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
                 &local_278);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model != sup) {
        saveVectors(this);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
      std::ifstream::~ifstream(&ifs);
      return;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Input file cannot be opened!");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  exit(1);
}

Assistant:

void FastText::train(std::shared_ptr<Args> args) {
  args_ = args;
  dict_ = std::make_shared<Dictionary>(args_);
  if (args_->input == "-") {
    // manage expectations
    std::cerr << "Cannot use stdin for training!" << std::endl;
    exit(EXIT_FAILURE);
  }
  std::ifstream ifs(args_->input);
  if (!ifs.is_open()) {
    std::cerr << "Input file cannot be opened!" << std::endl;
    exit(EXIT_FAILURE);
  }
  dict_->readFromFile(ifs);
  ifs.close();

  if (args_->pretrainedVectors.size() != 0) {
    std::cout << "loading pre-trained subwords from: " << args_->pretrainedVectors << std::endl;
    loadVectors(args_->pretrainedVectors);
  } else {
    input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
    input_->uniform(1.0 / args_->dim);
  }

  if (args_->model == model_name::sup) {
    output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
  } else {
    output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
  }
  output_->zero();

//  reduceCorpus(0);
//  exit(-1);

  start = clock();
  tokenCount = 0;
  std::vector<std::thread> threads;
  std::cout <<  "Created threads: " << dict_->nwords() << std::endl;
  for (int32_t i = 0; i < args_->thread; i++) {
    threads.push_back(std::thread([=]() { trainThread(i); }));
  }
  for (auto it = threads.begin(); it != threads.end(); ++it) {
    it->join();
  }
  model_ = std::make_shared<Model>(input_, output_, args_, 0);

  //saveModel();
  if (args_->model != model_name::sup) {
    saveVectors();
  }
}